

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O3

int32_t WebRtcAgc_InitDigital(DigitalAgc *stt,int16_t agcMode)

{
  stt->capacitorSlow = (uint)(agcMode != 3) << 0x1b;
  stt->capacitorFast = 0;
  stt->gain = 0x10000;
  stt->gatePrevious = 0;
  stt->agcMode = agcMode;
  (stt->vadNearend).HPstate = 0;
  (stt->vadNearend).counter = 3;
  (stt->vadNearend).logRatio = 0;
  (stt->vadNearend).meanLongTerm = 0x3c00;
  (stt->vadNearend).varianceLongTerm = 0x1f400;
  (stt->vadNearend).stdLongTerm = 0;
  (stt->vadNearend).meanShortTerm = 0x3c00;
  (stt->vadNearend).varianceShortTerm = 0x1f400;
  (stt->vadNearend).stdShortTerm = 0;
  (stt->vadNearend).downState[0] = 0;
  (stt->vadNearend).downState[1] = 0;
  (stt->vadNearend).downState[2] = 0;
  (stt->vadNearend).downState[3] = 0;
  (stt->vadNearend).downState[4] = 0;
  (stt->vadNearend).downState[5] = 0;
  (stt->vadNearend).downState[6] = 0;
  (stt->vadNearend).downState[7] = 0;
  (stt->vadFarend).HPstate = 0;
  (stt->vadFarend).counter = 3;
  (stt->vadFarend).logRatio = 0;
  (stt->vadFarend).meanLongTerm = 0x3c00;
  (stt->vadFarend).varianceLongTerm = 0x1f400;
  (stt->vadFarend).stdLongTerm = 0;
  (stt->vadFarend).meanShortTerm = 0x3c00;
  (stt->vadFarend).varianceShortTerm = 0x1f400;
  (stt->vadFarend).stdShortTerm = 0;
  (stt->vadFarend).downState[4] = 0;
  (stt->vadFarend).downState[5] = 0;
  (stt->vadFarend).downState[6] = 0;
  (stt->vadFarend).downState[7] = 0;
  (stt->vadFarend).downState[0] = 0;
  (stt->vadFarend).downState[1] = 0;
  (stt->vadFarend).downState[2] = 0;
  (stt->vadFarend).downState[3] = 0;
  return 0;
}

Assistant:

int32_t WebRtcAgc_InitDigital(DigitalAgc *stt, int16_t agcMode) {
    if (agcMode == kAgcModeFixedDigital) {
        // start at minimum to find correct gain faster
        stt->capacitorSlow = 0;
    } else {
        // start out with 0 dB gain
        stt->capacitorSlow = 134217728;  // (int32_t)(0.125f * 32768.0f * 32768.0f);
    }
    stt->capacitorFast = 0;
    stt->gain = 65536;
    stt->gatePrevious = 0;
    stt->agcMode = agcMode;
#ifdef WEBRTC_AGC_DEBUG_DUMP
    stt->frameCounter = 0;
#endif

    // initialize VADs
    WebRtcAgc_InitVad(&stt->vadNearend);
    WebRtcAgc_InitVad(&stt->vadFarend);

    return 0;
}